

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void test_qpixl_frqi_util_isfwht<float>(void)

{
  allocator<float> *this;
  float fVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  bool bVar2;
  reference pvVar3;
  char *pcVar4;
  AssertHelper local_300;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_15;
  Message local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_14;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_13;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_12;
  Message local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_11;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_10;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_9;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_8;
  Message local_1f8;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_7;
  Message local_1d8;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_6;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_5;
  Message local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_4;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_3;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  float local_f8 [16];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  vector<float,_std::allocator<float>_> a_c;
  allocator<float> local_79;
  float local_78 [16];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<float,_std::allocator<float>_> a;
  float eps;
  
  a.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = std::numeric_limits<float>::epsilon();
  local_78[0xc] = -2.81;
  local_78[0xd] = -3.41;
  local_78[0xe] = -1.88;
  local_78[0xf] = 10.0;
  local_78[8] = 6.22;
  local_78[9] = -13.57;
  local_78[10] = 4.9;
  local_78[0xb] = 5.31;
  local_78[4] = 0.0;
  local_78[5] = -7.0;
  local_78[6] = 1.11;
  local_78[7] = 1.45;
  local_78[0] = 1.34;
  local_78[1] = -3.24;
  local_78[2] = 2.88;
  local_78[3] = 16.2;
  local_38 = local_78;
  local_30 = 0x10;
  std::allocator<float>::allocator(&local_79);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_28,__l_00,&local_79);
  std::allocator<float>::~allocator(&local_79);
  local_f8[0xc] = -2.81;
  local_f8[0xd] = -3.41;
  local_f8[0xe] = -1.88;
  local_f8[0xf] = 10.0;
  local_f8[8] = 6.22;
  local_f8[9] = -13.57;
  local_f8[10] = 4.9;
  local_f8[0xb] = 5.31;
  local_f8[4] = 0.0;
  local_f8[5] = -7.0;
  local_f8[6] = 1.11;
  local_f8[7] = 1.45;
  local_f8[0] = 1.34;
  local_f8[1] = -3.24;
  local_f8[2] = 2.88;
  local_f8[3] = 16.2;
  local_b8 = local_f8;
  local_b0 = 0x10;
  this = (allocator<float> *)
         ((long)&gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         + 7);
  std::allocator<float>::allocator(this);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a8,__l,this);
  std::allocator<float>::~allocator
            ((allocator<float> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  qpixl::frqi::sfwht<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_28);
  qpixl::frqi::isfwht<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_28);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_110,"a[ 0]","a_c[ 0]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x4f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,1);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_130,"a[ 1]","a_c[ 1]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x50,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,2);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,2);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_150,"a[ 2]","a_c[ 2]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x51,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,3);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,3);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_170,"a[ 3]","a_c[ 3]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_178);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x52,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,4);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,4);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_190,"a[ 4]","a_c[ 4]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar2) {
    testing::Message::Message(&local_198);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x53,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,5);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1b0,"a[ 5]","a_c[ 5]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x54,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,6);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,6);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1d0,"a[ 6]","a_c[ 6]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x55,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,7);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,7);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1f0,"a[ 7]","a_c[ 7]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_1f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x56,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,8);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,8);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_210,"a[ 8]","a_c[ 8]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar2) {
    testing::Message::Message(&local_218);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,9);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,9);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_230,"a[ 9]","a_c[ 9]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x58,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,10);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,10);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_250,"a[10]","a_c[10]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar2) {
    testing::Message::Message(&local_258);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xb);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,0xb);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_270,"a[11]","a_c[11]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xc);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,0xc);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_290,"a[12]","a_c[12]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(&local_298);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xd);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,0xd);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2b0,"a[13]","a_c[13]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xe);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,0xe);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2d0,"a[14]","a_c[14]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_28,0xf);
  fVar1 = *pvVar3;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_a8,0xf);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2f0,"a[15]","a_c[15]","100*eps",(double)fVar1,(double)*pvVar3,
             1.1920928955078125e-05);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/util.cpp"
               ,0x5e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_a8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_28);
  return;
}

Assistant:

void test_qpixl_frqi_util_isfwht() {

  const R eps = std::numeric_limits< R >::epsilon() ;

  std::vector< R > a = { 1.34 , -3.24 , 2.88 , 16.2 , 0 , -7 , 1.11 , 1.45 ,
                           6.22 , -13.57 , 4.9 , 5.31 , -2.81 , - 3.41 , -1.88 ,
                           10 };

  std::vector< R > a_c = { 1.34 , -3.24 , 2.88 , 16.2 , 0 , -7 , 1.11 , 1.45 ,
                           6.22 , -13.57 , 4.9 , 5.31 , -2.81 , - 3.41 , -1.88 ,
                           10 };
  qpixl::frqi::sfwht( a ) ;
  qpixl::frqi::isfwht( a ) ;

  EXPECT_NEAR( a[ 0] , a_c[ 0]  , 100*eps );
  EXPECT_NEAR( a[ 1] , a_c[ 1]  , 100*eps );
  EXPECT_NEAR( a[ 2] , a_c[ 2]  , 100*eps );
  EXPECT_NEAR( a[ 3] , a_c[ 3]  , 100*eps );
  EXPECT_NEAR( a[ 4] , a_c[ 4]  , 100*eps );
  EXPECT_NEAR( a[ 5] , a_c[ 5]  , 100*eps );
  EXPECT_NEAR( a[ 6] , a_c[ 6]  , 100*eps );
  EXPECT_NEAR( a[ 7] , a_c[ 7]  , 100*eps );
  EXPECT_NEAR( a[ 8] , a_c[ 8]  , 100*eps );
  EXPECT_NEAR( a[ 9] , a_c[ 9]  , 100*eps );
  EXPECT_NEAR( a[10] , a_c[10]  , 100*eps );
  EXPECT_NEAR( a[11] , a_c[11]  , 100*eps );
  EXPECT_NEAR( a[12] , a_c[12]  , 100*eps );
  EXPECT_NEAR( a[13] , a_c[13]  , 100*eps );
  EXPECT_NEAR( a[14] , a_c[14]  , 100*eps );
  EXPECT_NEAR( a[15] , a_c[15]  , 100*eps );

}